

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

void __thiscall Command::Command(Command *this,string *cmd,char *extraArgs)

{
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(in_stack_ffffffffffffffe0,in_RDI);
  std::__cxx11::string::string(in_stack_ffffffffffffffe0,in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_RDX,(allocator<char> *)in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  *(undefined1 *)&in_RDI[3]._M_dataplus._M_p = 0;
  return;
}

Assistant:

Command(std::string cmd, const char *extraArgs)
      : cmd_id_(cmd), cmd_(cmd), extraArgs_(extraArgs) {}